

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O0

void * __thiscall
PoolResource<48UL,_8UL>::Allocate(PoolResource<48UL,_8UL> *this,size_t bytes,size_t alignment)

{
  long lVar1;
  bool bVar2;
  PoolResource<48UL,_8UL> *this_00;
  reference ppLVar3;
  align_val_t in_RDX;
  ulong in_RSI;
  array<PoolResource<48UL,_8UL>::ListNode_*,_7UL> *in_RDI;
  long in_FS_OFFSET;
  ptrdiff_t round_bytes;
  size_t num_alignments;
  size_t in_stack_ffffffffffffffa8;
  byte **in_stack_ffffffffffffffb0;
  ListNode *local_18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsFreeListUsable((size_t)in_RDI,(size_t)in_stack_ffffffffffffffb0);
  if (bVar2) {
    this_00 = (PoolResource<48UL,_8UL> *)NumElemAlignBytes(in_stack_ffffffffffffffa8);
    ppLVar3 = std::array<PoolResource<48UL,_8UL>::ListNode_*,_7UL>::operator[]
                        (in_RDI,(size_type)in_stack_ffffffffffffffb0);
    if (*ppLVar3 == (value_type)0x0) {
      if ((long)in_RDI[1]._M_elems[5] - (long)in_RDI[1]._M_elems[4] < (long)this_00 * 8) {
        AllocateChunk(this_00);
      }
      local_18 = (ListNode *)
                 std::exchange<std::byte*,std::byte*>((byte **)in_RDI,in_stack_ffffffffffffffb0);
    }
    else {
      ppLVar3 = std::array<PoolResource<48UL,_8UL>::ListNode_*,_7UL>::operator[]
                          (in_RDI,(size_type)in_stack_ffffffffffffffb0);
      std::array<PoolResource<48UL,_8UL>::ListNode_*,_7UL>::operator[](in_RDI,(size_type)ppLVar3);
      local_18 = std::exchange<PoolResource<48ul,8ul>::ListNode*,PoolResource<48ul,8ul>::ListNode*&>
                           (in_RDI->_M_elems,ppLVar3);
    }
  }
  else {
    local_18 = (ListNode *)operator_new(in_RSI,in_RDX);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_18;
  }
  __stack_chk_fail();
}

Assistant:

void* Allocate(std::size_t bytes, std::size_t alignment)
    {
        if (IsFreeListUsable(bytes, alignment)) {
            const std::size_t num_alignments = NumElemAlignBytes(bytes);
            if (nullptr != m_free_lists[num_alignments]) {
                // we've already got data in the pool's freelist, unlink one element and return the pointer
                // to the unlinked memory. Since FreeList is trivially destructible we can just treat it as
                // uninitialized memory.
                return std::exchange(m_free_lists[num_alignments], m_free_lists[num_alignments]->m_next);
            }

            // freelist is empty: get one allocation from allocated chunk memory.
            const std::ptrdiff_t round_bytes = static_cast<std::ptrdiff_t>(num_alignments * ELEM_ALIGN_BYTES);
            if (round_bytes > m_available_memory_end - m_available_memory_it) {
                // slow path, only happens when a new chunk needs to be allocated
                AllocateChunk();
            }

            // Make sure we use the right amount of bytes for that freelist (might be rounded up),
            return std::exchange(m_available_memory_it, m_available_memory_it + round_bytes);
        }

        // Can't use the pool => use operator new()
        return ::operator new (bytes, std::align_val_t{alignment});
    }